

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
slang::ast::Scope::handleUserDefinedNet(Scope *this,UserDefinedNetDeclarationSyntax *syntax)

{
  DeferredMemberIndex DVar1;
  iterator ppNVar2;
  Token *in_RDI;
  SourceRange SVar3;
  NetSymbol *sym;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::ast::NetSymbol_*,_5UL> *__range2;
  SmallVector<const_slang::ast::NetSymbol_*,_5UL> results;
  Symbol *symbol;
  DeferredMemberIndex savedIndex;
  Scope *in_stack_00000258;
  bitmask<slang::ast::LookupFlags> in_stack_00000264;
  LookupLocation in_stack_00000268;
  string_view in_stack_00000278;
  SourceRange in_stack_000002a0;
  DeferredMemberIndex *in_stack_ffffffffffffff08;
  SourceLocation symbol_00;
  DeferredMemberIndex *in_stack_ffffffffffffff10;
  SourceLocation this_00;
  Token *in_stack_ffffffffffffff30;
  iterator local_c0;
  SmallVectorBase<const_slang::ast::NetSymbol_*> local_a0 [2];
  bitmask<slang::ast::LookupFlags> local_5c;
  UserDefinedNetDeclarationSyntax *syntax_00;
  Scope *scope;
  
  DVar1 = std::
          exchange<slang::ast::Scope::DeferredMemberIndex,slang::ast::Scope::DeferredMemberIndex>
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  parsing::Token::valueText(in_RDI);
  syntax_00 = LookupLocation::max;
  scope = DAT_0101c840;
  SVar3 = parsing::Token::range(in_stack_ffffffffffffff30);
  bitmask<slang::ast::LookupFlags>::bitmask(&local_5c,None);
  symbol_00 = SVar3.startLoc;
  this_00 = SVar3.endLoc;
  Lookup::unqualifiedAt
            (in_stack_00000258,in_stack_00000278,in_stack_00000268,in_stack_000002a0,
             in_stack_00000264);
  *(DeferredMemberIndex *)&in_RDI[2].info = DVar1;
  SmallVector<const_slang::ast::NetSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::NetSymbol_*,_5UL> *)0x9f0ab3);
  NetSymbol::fromSyntax
            (scope,syntax_00,(Symbol *)SVar3.endLoc,
             (SmallVectorBase<const_slang::ast::NetSymbol_*> *)SVar3.startLoc);
  local_c0 = SmallVectorBase<const_slang::ast::NetSymbol_*>::begin(local_a0);
  ppNVar2 = SmallVectorBase<const_slang::ast::NetSymbol_*>::end(local_a0);
  for (; local_c0 != ppNVar2; local_c0 = local_c0 + 1) {
    addMember((Scope *)this_00,(Symbol *)symbol_00);
  }
  SmallVector<const_slang::ast::NetSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::NetSymbol_*,_5UL> *)0x9f0b5c);
  return;
}

Assistant:

void Scope::handleUserDefinedNet(const UserDefinedNetDeclarationSyntax& syntax) {
    // We aren't elaborated yet so can't do a normal lookup in this scope.
    // Temporarily swap out the deferred member index so that the lookup
    // doesn't trigger elaboration.
    auto savedIndex = std::exchange(deferredMemberIndex, DeferredMemberIndex::Invalid);
    auto symbol = Lookup::unqualifiedAt(*this, syntax.netType.valueText(), LookupLocation::max,
                                        syntax.netType.range());
    deferredMemberIndex = savedIndex;

    SmallVector<const NetSymbol*> results;
    NetSymbol::fromSyntax(*this, syntax, symbol, results);
    for (auto sym : results)
        addMember(*sym);
}